

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O3

void Lpk_CreateCommonOrder
               (char (*pTable) [16],int *piCofVar,int nCBars,int *pPrios,int nVars,int fVerbose)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int Score [16];
  int pPres [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int aiStack_78 [18];
  long lVar12;
  
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  uVar8 = (ulong)(uint)nVars;
  if (0 < nVars) {
    lVar2 = uVar8 - 1;
    auVar9._8_4_ = (int)lVar2;
    auVar9._0_8_ = lVar2;
    auVar9._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    auVar9 = auVar9 ^ _DAT_008403e0;
    auVar11 = _DAT_008403c0;
    auVar15 = _DAT_008403d0;
    do {
      auVar14 = auVar15 ^ _DAT_008403e0;
      iVar5 = auVar9._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar5 && auVar9._0_4_ < auVar14._0_4_ || iVar5 < auVar14._4_4_)
                & 1)) {
        *(undefined4 *)((long)aiStack_78 + lVar2) = 1;
      }
      if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
          auVar14._12_4_ <= auVar9._12_4_) {
        *(undefined4 *)((long)aiStack_78 + lVar2 + 4) = 1;
      }
      iVar16 = SUB164(auVar11 ^ _DAT_008403e0,4);
      if (iVar16 <= iVar5 && (iVar16 != iVar5 || SUB164(auVar11 ^ _DAT_008403e0,0) <= auVar9._0_4_))
      {
        *(undefined4 *)((long)aiStack_78 + lVar2 + 8) = 1;
        *(undefined4 *)((long)aiStack_78 + lVar2 + 0xc) = 1;
      }
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar12 + 4;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar12 + 4;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(nVars + 3U >> 2) << 4 != lVar2);
  }
  if (0 < nCBars) {
    uVar3 = 0;
    do {
      aiStack_78[piCofVar[uVar3]] = 0;
      uVar3 = uVar3 + 1;
    } while ((uint)nCBars != uVar3);
  }
  if (nVars < 1) {
    if (fVerbose == 0) {
      bVar1 = true;
      goto LAB_00493e7e;
    }
    printf("Scores: ");
LAB_00493d4a:
    bVar1 = false;
    printf("   ");
    printf("Prios: ");
  }
  else {
    uVar3 = 0;
    pcVar6 = *pTable;
    do {
      if (aiStack_78[uVar3] != 0) {
        iVar5 = *(int *)(local_b8 + uVar3 * 4);
        uVar7 = 0;
        do {
          iVar5 = iVar5 + (*pTable)[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
        *(int *)(local_b8 + uVar3 * 4) = iVar5;
        lVar2 = 0;
        do {
          iVar5 = iVar5 - pcVar6[lVar2];
          lVar2 = lVar2 + 0x10;
        } while (uVar8 << 4 != lVar2);
        *(int *)(local_b8 + uVar3 * 4) = iVar5;
      }
      uVar3 = uVar3 + 1;
      pTable = pTable + 1;
      pcVar6 = pcVar6 + 1;
    } while (uVar3 != uVar8);
    if (fVerbose != 0) {
      printf("Scores: ");
      if (0 < nVars) {
        uVar3 = 0;
        do {
          printf("%c=%d ",(ulong)((int)uVar3 + 0x61),(ulong)*(uint *)(local_b8 + uVar3 * 4));
          uVar3 = uVar3 + 1;
        } while (uVar8 != uVar3);
      }
      goto LAB_00493d4a;
    }
    bVar1 = true;
  }
  auVar11 = _DAT_008403e0;
  if (0 < nVars) {
    lVar2 = uVar8 - 1;
    auVar10._8_4_ = (int)lVar2;
    auVar10._0_8_ = lVar2;
    auVar10._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    auVar10 = auVar10 ^ _DAT_008403e0;
    auVar14 = _DAT_008403c0;
    auVar13 = _DAT_008403d0;
    do {
      auVar15 = auVar13 ^ auVar11;
      iVar5 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar5 && auVar10._0_4_ < auVar15._0_4_ || iVar5 < auVar15._4_4_)
                & 1)) {
        *(undefined4 *)((long)pPrios + lVar2) = 0x10;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)pPrios + lVar2 + 4) = 0x10;
      }
      auVar15 = auVar14 ^ auVar11;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar5 && (iVar16 != iVar5 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)pPrios + lVar2 + 8) = 0x10;
        *(undefined4 *)((long)pPrios + lVar2 + 0xc) = 0x10;
      }
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar12 + 4;
      lVar12 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar12 + 4;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(nVars + 3U >> 2) << 4 != lVar2);
  }
LAB_00493e7e:
  if (0 < nVars) {
    uVar3 = 1;
    do {
      uVar7 = 0xffffffff;
      iVar5 = -100000;
      uVar4 = 0;
      do {
        if (aiStack_78[uVar4] != 0) {
          iVar16 = *(int *)(local_b8 + uVar4 * 4);
          if (iVar5 < iVar16) {
            uVar7 = uVar4 & 0xffffffff;
          }
          if (iVar5 <= iVar16) {
            iVar5 = iVar16;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
      if ((int)uVar7 == -1) break;
      if (!bVar1) {
        printf("%d=",uVar3);
      }
      if (0 < nVars) {
        uVar7 = 0;
        do {
          if ((aiStack_78[uVar7] != 0) && (*(int *)(local_b8 + uVar7 * 4) == iVar5)) {
            pPrios[uVar7] = (int)uVar3;
            aiStack_78[uVar7] = 0;
            if (!bVar1) {
              putchar((int)uVar7 + 0x61);
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      if (!bVar1) {
        putchar(0x20);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (0 < nVars);
  }
  if (bVar1) {
    return;
  }
  putchar(10);
  return;
}

Assistant:

void Lpk_CreateCommonOrder( char pTable[][16], int piCofVar[], int nCBars, int pPrios[], int nVars, int fVerbose )
{
    int Score[16] = {0}, pPres[16];
    int i, y, x, iVarBest, ScoreMax, PrioCount;

    // mark the present variables
    for ( i = 0; i < nVars; i++ )
        pPres[i] = 1;
    // remove cofactored variables
    for ( i = 0; i < nCBars; i++ )
        pPres[piCofVar[i]] = 0;

    // compute scores for each leaf
    for ( i = 0; i < nVars; i++ )
    {
        if ( pPres[i] == 0 )
            continue;
        for ( y = 0; y < nVars; y++ )
            Score[i] += pTable[i][y];
        for ( x = 0; x < nVars; x++ )
            Score[i] -= pTable[x][i];
    }

    // print the scores
    if ( fVerbose )
    {
        printf( "Scores: " );
        for ( i = 0; i < nVars; i++ )
            printf( "%c=%d ", 'a'+i, Score[i] );
        printf( "   " );
        printf( "Prios: " );
    }

    // derive variable priority
    // variables with equal score receive the same priority
    for ( i = 0; i < nVars; i++ )
        pPrios[i] = 16;

    // iterate until variables remain
    for ( PrioCount = 1; ; PrioCount++ )
    {
        // find the present variable with the highest score
        iVarBest = -1;
        ScoreMax = -100000;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( ScoreMax < Score[i] )
            {
                ScoreMax = Score[i];
                iVarBest = i;
            }
        }
        if ( iVarBest == -1 )
            break;
        // give the next priority to all vars having this score
        if ( fVerbose )
            printf( "%d=", PrioCount );
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( Score[i] == ScoreMax )
            {
                pPrios[i] = PrioCount;
                pPres[i] = 0;
                if ( fVerbose )
                    printf( "%c", 'a'+i );
            }
        }
        if ( fVerbose )
            printf( " " );
    }
    if ( fVerbose )
        printf( "\n" );
}